

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::HeapType::getHeapTypeChildren
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          HeapType *this)

{
  undefined1 local_50 [8];
  HeapTypeChildCollector collector;
  HeapType *this_local;
  
  collector.children.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = this;
  anon_unknown_0::HeapTypeChildCollector::HeapTypeChildCollector((HeapTypeChildCollector *)local_50)
  ;
  anon_unknown_0::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::walkRoot
            ((TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector> *)local_50,
             this);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
            (__return_storage_ptr__,
             (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
             &collector.
              super_HeapTypeChildWalker<wasm::(anonymous_namespace)::HeapTypeChildCollector>.
              isTopLevel);
  anon_unknown_0::HeapTypeChildCollector::~HeapTypeChildCollector
            ((HeapTypeChildCollector *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<HeapType> HeapType::getHeapTypeChildren() const {
  HeapTypeChildCollector collector;
  collector.walkRoot(const_cast<HeapType*>(this));
  return collector.children;
}